

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O0

void __thiscall OptionParser_LongFlag_Test::TestBody(OptionParser_LongFlag_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_110;
  Message local_108;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  char *args [2];
  anon_class_8_1_898bac6a local_d0;
  NullCallback local_c8;
  undefined1 local_a8 [8];
  OptionParser parser;
  bool flag;
  OptionParser_LongFlag_Test *this_local;
  
  parser.on_error_._M_invoker._7_1_ = 0;
  wabt::OptionParser::OptionParser((OptionParser *)local_a8,"prog","desc");
  local_d0.flag = (bool *)((long)&parser.on_error_._M_invoker + 7);
  std::function<void()>::function<OptionParser_LongFlag_Test::TestBody()::__0,void>
            ((function<void()> *)&local_c8,&local_d0);
  wabt::OptionParser::AddOption((OptionParser *)local_a8,"flag","help",&local_c8);
  std::function<void_()>::~function(&local_c8);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)anon_var_dwarf_6db14;
  wabt::OptionParser::Parse((OptionParser *)local_a8,2,(char **)&gtest_ar.message_);
  local_f9 = true;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_f8,"true","flag",&local_f9,
             (bool *)((long)&parser.on_error_._M_invoker + 7));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-option-parser.cc"
               ,0x1f,message);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  wabt::OptionParser::~OptionParser((OptionParser *)local_a8);
  return;
}

Assistant:

TEST(OptionParser, LongFlag) {
  bool flag = false;
  OptionParser parser("prog", "desc");
  parser.AddOption("flag", "help", [&]() { flag = true; });
  const char* args[] = {"prog name", "--flag"};
  parser.Parse(2, const_cast<char**>(args));
  EXPECT_EQ(true, flag);
}